

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex.c
# Opt level: O1

int regex_compile(regex_handle *re,char *pattern)

{
  long *plVar1;
  int iVar2;
  long lVar3;
  int errorcode;
  size_t erroroffset;
  undefined1 local_24 [4];
  undefined1 local_20 [8];
  
  plVar1 = (long *)re->priv;
  if (*plVar1 != 0) {
    pcre2_code_free_8();
  }
  lVar3 = pcre2_compile_8(pattern,0xffffffffffffffff,0,local_24,local_20,0);
  *plVar1 = lVar3;
  iVar2 = -0x16;
  if (lVar3 != 0) {
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int regex_compile(struct regex_handle *re, const char *pattern)
{
	struct regex_priv *priv = re->priv;
	int errorcode;
	PCRE2_SIZE erroroffset;
	int ret;

	if (priv->re != NULL)
		pcre2_code_free(priv->re);

	priv->re = pcre2_compile((PCRE2_SPTR)pattern, PCRE2_ZERO_TERMINATED, 0,
				 &errorcode, &erroroffset, NULL);
	if (priv->re == NULL) {
		ret = -EINVAL;
		goto regex_compile_exit;
	}

	return 0;

regex_compile_exit:
	if (priv->re != NULL) {
		pcre2_code_free(priv->re);
		priv->re = NULL;
	}

	return ret;
}